

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

FUDMFKey * __thiscall FUDMFKeys::Find(FUDMFKeys *this,FName *key)

{
  int iVar1;
  int iVar2;
  FUDMFKey *pFVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (this->mSorted == false) {
    this->mSorted = true;
    Sort(this);
  }
  iVar4 = (this->super_TArray<FUDMFKey,_FUDMFKey>).Count - 1;
  pFVar3 = (this->super_TArray<FUDMFKey,_FUDMFKey>).Array;
  iVar6 = 0;
  while( true ) {
    if (iVar4 < iVar6) {
      return (FUDMFKey *)0x0;
    }
    uVar5 = (uint)(iVar4 + iVar6) >> 1;
    iVar1 = pFVar3[uVar5].Key.Index;
    iVar2 = key->Index;
    if (iVar1 == iVar2) break;
    if (iVar1 == iVar2 || iVar1 < iVar2) {
      iVar6 = uVar5 + 1;
    }
    else {
      iVar4 = uVar5 - 1;
    }
  }
  return pFVar3 + uVar5;
}

Assistant:

FUDMFKey *FUDMFKeys::Find(FName key)
{
	if (!mSorted)
	{
		mSorted = true;
		Sort();
	}
	int min = 0, max = Size()-1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		if ((*this)[mid].Key == key)
		{
			return &(*this)[mid];
		}
		else if ((*this)[mid].Key <= key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}